

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionRTQF.cpp
# Opt level: O1

void __thiscall RTFusionRTQF::update(RTFusionRTQF *this)

{
  RTQuaternion *pRVar1;
  RTQuaternion *this_00;
  float fVar2;
  float fVar3;
  RTQuaternion local_38;
  RTQuaternion local_28;
  
  if (((this->super_RTFusion).m_enableCompass != false) ||
     ((this->super_RTFusion).m_enableAccel == true)) {
    this_00 = &this->m_stateQ;
    local_38 = RTQuaternion::conjugate(this_00);
    local_28 = RTQuaternion::operator*(&local_38,&(this->super_RTFusion).m_measuredQPose);
    pRVar1 = &(this->super_RTFusion).m_rotationDelta;
    RTQuaternion::operator=(pRVar1,&local_28);
    RTQuaternion::normalize(pRVar1);
    fVar2 = acosf((this->super_RTFusion).m_rotationDelta.m_data[0]);
    fVar3 = sinf((this->super_RTFusion).m_slerpPower * fVar2);
    fVar2 = cosf(fVar2 * (this->super_RTFusion).m_slerpPower);
    (this->super_RTFusion).m_rotationUnitVector.m_data[0] =
         (this->super_RTFusion).m_rotationDelta.m_data[1];
    *(undefined8 *)((this->super_RTFusion).m_rotationUnitVector.m_data + 1) =
         *(undefined8 *)((this->super_RTFusion).m_rotationDelta.m_data + 2);
    RTVector3::normalize(&(this->super_RTFusion).m_rotationUnitVector);
    pRVar1 = &(this->super_RTFusion).m_rotationPower;
    (this->super_RTFusion).m_rotationPower.m_data[0] = fVar2;
    (this->super_RTFusion).m_rotationPower.m_data[1] =
         (this->super_RTFusion).m_rotationUnitVector.m_data[0] * fVar3;
    (this->super_RTFusion).m_rotationPower.m_data[2] =
         (this->super_RTFusion).m_rotationUnitVector.m_data[1] * fVar3;
    (this->super_RTFusion).m_rotationPower.m_data[3] =
         fVar3 * (this->super_RTFusion).m_rotationUnitVector.m_data[2];
    RTQuaternion::normalize(pRVar1);
    RTQuaternion::operator*=(this_00,pRVar1);
    RTQuaternion::normalize(this_00);
  }
  return;
}

Assistant:

void RTFusionRTQF::update()
{
    if (m_enableCompass || m_enableAccel) {

        // calculate rotation delta

        m_rotationDelta = m_stateQ.conjugate() * m_measuredQPose;
        m_rotationDelta.normalize();

        // take it to the power (0 to 1) to give the desired amount of correction

        RTFLOAT theta = acos(m_rotationDelta.scalar());

        RTFLOAT sinPowerTheta = sin(theta * m_slerpPower);
        RTFLOAT cosPowerTheta = cos(theta * m_slerpPower);

        m_rotationUnitVector.setX(m_rotationDelta.x());
        m_rotationUnitVector.setY(m_rotationDelta.y());
        m_rotationUnitVector.setZ(m_rotationDelta.z());
        m_rotationUnitVector.normalize();

        m_rotationPower.setScalar(cosPowerTheta);
        m_rotationPower.setX(sinPowerTheta * m_rotationUnitVector.x());
        m_rotationPower.setY(sinPowerTheta * m_rotationUnitVector.y());
        m_rotationPower.setZ(sinPowerTheta * m_rotationUnitVector.z());
        m_rotationPower.normalize();

        //  multiple this by predicted value to get result

        m_stateQ *= m_rotationPower;
        m_stateQ.normalize();
    }
}